

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::mergeBodies
          (TIntermediate *this,TInfoSink *infoSink,TIntermSequence *globals,
          TIntermSequence *unitGlobals)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_01;
  TString *t;
  pointer ppTVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long *plVar3;
  undefined4 extraout_var_00;
  
  ppTVar5 = (globals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
            super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((long)ppTVar5 -
      (long)(globals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
            super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
            super__Vector_impl_data._M_start != 8) {
    uVar6 = 0;
    do {
      if ((long)(unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_start != 8) {
        uVar7 = 0;
        uVar8 = 1;
        do {
          iVar2 = (*(globals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar6]->_vptr_TIntermNode[6])();
          plVar3 = (long *)CONCAT44(extraout_var,iVar2);
          iVar2 = (*(unitGlobals->
                    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar7]->_vptr_TIntermNode[6])();
          plVar4 = (long *)CONCAT44(extraout_var_00,iVar2);
          if ((((plVar3 != (long *)0x0) && (plVar4 != (long *)0x0)) && ((int)plVar3[0x17] == 5)) &&
             ((int)plVar4[0x17] == 5)) {
            this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*plVar3 + 0x1a8))(plVar3);
            __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*plVar4 + 0x1a8))(plVar4);
            iVar2 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(this_00,__str);
            if (iVar2 == 0) {
              error(this,infoSink,
                    "Multiple function bodies in multiple compilation units for the same signature in the same stage:"
                    ,EShLangCount);
              TInfoSinkBase::append(&infoSink->info,"    ");
              iVar2 = (*(globals->
                        super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar6]->_vptr_TIntermNode[6])();
              t = (TString *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x1a8))
                            ((long *)CONCAT44(extraout_var_01,iVar2));
              TInfoSinkBase::append(&infoSink->info,t);
              TInfoSinkBase::append(&infoSink->info,"\n");
            }
          }
          bVar1 = uVar8 < ((long)(unitGlobals->
                                 super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ).
                                 super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(unitGlobals->
                                 super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ).
                                 super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U;
          uVar7 = uVar8;
          uVar8 = (ulong)((int)uVar8 + 1);
        } while (bVar1);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      ppTVar5 = (globals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (uVar6 < ((long)ppTVar5 -
                      (long)(globals->
                            super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                            super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U);
  }
  std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<TIntermNode*const*,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>>
            ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)globals,ppTVar5 + -1,
             (unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (unitGlobals->super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
             super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish + -1);
  return;
}

Assistant:

void TIntermediate::mergeBodies(TInfoSink& infoSink, TIntermSequence& globals, const TIntermSequence& unitGlobals)
{
    // TODO: link-time performance: Processing in alphabetical order will be faster

    // Error check the global objects, not including the linker objects
    for (unsigned int child = 0; child < globals.size() - 1; ++child) {
        for (unsigned int unitChild = 0; unitChild < unitGlobals.size() - 1; ++unitChild) {
            TIntermAggregate* body = globals[child]->getAsAggregate();
            TIntermAggregate* unitBody = unitGlobals[unitChild]->getAsAggregate();
            if (body && unitBody && body->getOp() == EOpFunction && unitBody->getOp() == EOpFunction && body->getName() == unitBody->getName()) {
                error(infoSink, "Multiple function bodies in multiple compilation units for the same signature in the same stage:");
                infoSink.info << "    " << globals[child]->getAsAggregate()->getName() << "\n";
            }
        }
    }

    // Merge the global objects, just in front of the linker objects
    globals.insert(globals.end() - 1, unitGlobals.begin(), unitGlobals.end() - 1);
}